

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O3

FT_String * tt_name_ascii_from_utf16(TT_Name entry,FT_Memory memory)

{
  ushort uVar1;
  FT_Byte *pFVar2;
  FT_String *pFVar3;
  ulong uVar4;
  ulong uVar5;
  FT_String *pFVar6;
  FT_Byte FVar7;
  uint uVar8;
  FT_Error error;
  int local_2c;
  
  pFVar2 = entry->string;
  uVar1 = entry->stringLength;
  uVar4 = (ulong)(uVar1 >> 1);
  pFVar3 = (FT_String *)ft_mem_qrealloc(memory,1,0,uVar4 + 1,(void *)0x0,&local_2c);
  pFVar6 = (FT_String *)0x0;
  if (local_2c == 0) {
    if (uVar1 < 2) {
      uVar4 = 0;
    }
    else {
      uVar5 = 0;
      do {
        FVar7 = pFVar2[uVar5 * 2 + 1];
        uVar8 = (uint)CONCAT11(pFVar2[uVar5 * 2],FVar7);
        if (uVar8 == 0) {
          uVar4 = uVar5 & 0xffffffff;
          break;
        }
        if (uVar8 - 0x80 < 0xffffffa0) {
          FVar7 = '?';
        }
        pFVar3[uVar5] = FVar7;
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    pFVar3[uVar4] = '\0';
    pFVar6 = pFVar3;
  }
  return pFVar6;
}

Assistant:

static FT_String*
  tt_name_ascii_from_utf16( TT_Name    entry,
                            FT_Memory  memory )
  {
    FT_String*  string = NULL;
    FT_UInt     len, code, n;
    FT_Byte*    read   = (FT_Byte*)entry->string;
    FT_Error    error;


    len = (FT_UInt)entry->stringLength / 2;

    if ( FT_QNEW_ARRAY( string, len + 1 ) )
      return NULL;

    for ( n = 0; n < len; n++ )
    {
      code = FT_NEXT_USHORT( read );

      if ( code == 0 )
        break;

      if ( code < 32 || code > 127 )
        code = '?';

      string[n] = (char)code;
    }

    string[n] = 0;

    return string;
  }